

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingAdaptedStructs.cpp
# Opt level: O0

int main(void)

{
  cx_string<15UL> cVar1;
  Severity SVar2;
  SessionWriter *pSVar3;
  data_ref pacVar4;
  data_ref pacVar5;
  data_ref pacVar6;
  data_ref pacVar7;
  data_ref pacVar8;
  data_ref pacVar9;
  data_ref pacVar10;
  data_ref pacVar11;
  cx_string<12UL> cVar12;
  uint64_t _binlog_sid_v_9;
  uint64_t _binlog_sid_v_8;
  uint64_t _binlog_sid_v_7;
  uint64_t _binlog_sid_v_6;
  uint64_t _binlog_sid_v_5;
  uint64_t _binlog_sid_v_4;
  uint64_t _binlog_sid_v_3;
  uint64_t _binlog_sid_v_2;
  uint64_t _binlog_sid_v_1;
  uint64_t _binlog_sid_v;
  memory_order __b_18;
  memory_order __b_16;
  memory_order __b_14;
  memory_order __b_12;
  memory_order __b_10;
  memory_order __b_8;
  memory_order __b_6;
  memory_order __b_4;
  memory_order __b_2;
  memory_order __b;
  memory_order __b_19;
  memory_order __b_17;
  memory_order __b_15;
  memory_order __b_13;
  memory_order __b_11;
  memory_order __b_9;
  memory_order __b_7;
  memory_order __b_5;
  memory_order __b_3;
  memory_order __b_1;
  char (*in_stack_ffffffffffffeca8) [14];
  EventSource *in_stack_ffffffffffffecb0;
  Pair *in_stack_ffffffffffffecb8;
  __atomic_base<unsigned_long> eventSourceId;
  SessionWriter *in_stack_ffffffffffffecc0;
  Foo *in_stack_ffffffffffffecc8;
  atomic<unsigned_long> *paVar13;
  undefined4 in_stack_ffffffffffffecd0;
  undefined4 in_stack_ffffffffffffecd4;
  EventSource *in_stack_ffffffffffffecd8;
  Session *in_stack_ffffffffffffece0;
  Session *this;
  Single *in_stack_ffffffffffffece8;
  char (*in_stack_ffffffffffffecf0) [3];
  string *this_00;
  undefined1 local_c54 [15];
  undefined1 local_c45;
  undefined1 local_c44;
  undefined1 local_c43;
  undefined1 local_c42;
  undefined1 local_c41 [45];
  allocator local_c14;
  allocator local_c13;
  allocator local_c12;
  allocator local_c11;
  undefined8 local_c10;
  undefined2 local_c08;
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  undefined8 local_ba0;
  string local_b98 [32];
  string local_b78 [32];
  __atomic_base<unsigned_long> local_b58;
  allocator local_b49;
  undefined4 local_b48;
  string local_b40 [34];
  undefined1 local_b1e;
  undefined1 local_b1d;
  undefined1 local_b1c;
  undefined1 local_b1b;
  allocator local_b1a;
  allocator local_b19;
  undefined4 local_b18;
  string local_b10 [33];
  cx_string<18UL> local_aef;
  allocator local_adc;
  allocator local_adb;
  allocator local_ada;
  allocator local_ad9;
  undefined8 local_ad8;
  undefined2 local_ad0;
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  undefined8 local_a68;
  string local_a60 [32];
  string local_a40 [32];
  __atomic_base<unsigned_long> local_a20;
  undefined1 local_a11;
  undefined1 local_a10;
  undefined1 local_a0f;
  undefined1 local_a0e;
  allocator local_a0d;
  cx_string<31UL> local_a0c;
  allocator local_9ec;
  allocator local_9eb;
  allocator local_9ea;
  allocator local_9e9;
  undefined8 local_9e8;
  undefined2 local_9e0;
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  undefined8 local_978;
  string local_970 [32];
  string local_950 [32];
  __atomic_base<unsigned_long> local_930;
  undefined4 local_924;
  undefined1 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  undefined1 local_911;
  undefined1 local_910;
  undefined1 local_90f;
  undefined1 local_90e;
  allocator local_90d;
  undefined4 local_90c;
  undefined1 local_908;
  undefined4 local_904;
  undefined4 local_900;
  cx_string<29UL> local_8fa;
  allocator local_8dc;
  allocator local_8db;
  allocator local_8da;
  allocator local_8d9;
  undefined8 local_8d8;
  undefined2 local_8d0;
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  undefined8 local_868;
  string local_860 [32];
  string local_840 [32];
  __atomic_base<unsigned_long> local_820;
  Private local_818;
  undefined1 local_80d;
  undefined1 local_80c;
  undefined1 local_80b;
  undefined1 local_80a;
  allocator local_809;
  Private local_808;
  cx_string<17UL> local_7fe;
  allocator local_7ec;
  allocator local_7eb;
  allocator local_7ea;
  allocator local_7e9;
  undefined8 local_7e8;
  undefined2 local_7e0;
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  undefined8 local_778;
  string local_770 [32];
  string local_750 [32];
  __atomic_base<unsigned_long> local_730;
  undefined4 local_728;
  undefined1 local_721;
  undefined1 local_720;
  undefined1 local_71f;
  undefined1 local_71e;
  allocator local_71d;
  undefined4 local_71c;
  cx_string<25UL> local_716;
  allocator local_6fc;
  allocator local_6fb;
  allocator local_6fa;
  allocator local_6f9;
  undefined8 local_6f8;
  undefined2 local_6f0;
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  undefined8 local_688;
  string local_680 [32];
  string local_660 [32];
  __atomic_base<unsigned_long> local_640;
  undefined1 local_634;
  undefined1 local_633;
  undefined1 local_632;
  undefined1 local_631;
  allocator local_630 [2];
  cx_string<17UL> local_62e;
  allocator local_61c;
  allocator local_61b;
  allocator local_61a;
  allocator local_619;
  undefined8 local_618;
  undefined2 local_610;
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  undefined8 local_5a8;
  string local_5a0 [32];
  string local_580 [32];
  __atomic_base<unsigned_long> local_560;
  allocator local_551;
  undefined4 local_550;
  string local_548 [34];
  undefined1 local_526;
  undefined1 local_525;
  undefined1 local_524;
  undefined1 local_523;
  allocator local_522;
  allocator local_521;
  undefined4 local_520;
  string local_518 [36];
  cx_string<15UL> local_4f4;
  allocator local_4e4;
  allocator local_4e3;
  allocator local_4e2;
  allocator local_4e1;
  undefined8 local_4e0;
  undefined2 local_4d8;
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  undefined8 local_470;
  string local_468 [32];
  string local_448 [32];
  __atomic_base<unsigned_long> local_428;
  undefined4 local_41c;
  undefined1 local_415;
  undefined1 local_414;
  undefined1 local_413;
  undefined1 local_412;
  allocator local_411;
  char local_410 [5];
  char acStack_40b [3];
  undefined4 local_408;
  char local_404;
  undefined4 local_3fc;
  cx_string<12UL> local_3f8;
  allocator local_3e4;
  allocator local_3e3;
  allocator local_3e2;
  allocator local_3e1;
  undefined8 local_3e0;
  undefined2 local_3d8;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  undefined8 local_370;
  string local_368 [32];
  string local_348 [32];
  __atomic_base<unsigned_long> local_328;
  undefined1 local_31d;
  undefined1 local_31c;
  undefined1 local_31b;
  undefined1 local_31a;
  allocator local_319 [2];
  cx_string<7UL> local_317;
  allocator local_30f;
  allocator local_30e;
  allocator local_30d [20];
  allocator local_2f9;
  undefined8 local_2f8;
  undefined2 local_2f0;
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  undefined8 local_288;
  string local_280 [32];
  string local_260 [32];
  __atomic_base<unsigned_long> local_240;
  undefined4 local_234;
  __atomic_base<unsigned_long> local_230;
  memory_order local_228;
  undefined4 local_224;
  atomic<unsigned_long> *local_220;
  __atomic_base<unsigned_long> local_218;
  memory_order local_210;
  undefined4 local_20c;
  atomic<unsigned_long> *local_208;
  __atomic_base<unsigned_long> local_200;
  memory_order local_1f8;
  undefined4 local_1f4;
  atomic<unsigned_long> *local_1f0;
  __atomic_base<unsigned_long> local_1e8;
  memory_order local_1e0;
  undefined4 local_1dc;
  atomic<unsigned_long> *local_1d8;
  __atomic_base<unsigned_long> local_1d0;
  memory_order local_1c8;
  undefined4 local_1c4;
  atomic<unsigned_long> *local_1c0;
  __atomic_base<unsigned_long> local_1b8;
  memory_order local_1b0;
  undefined4 local_1ac;
  atomic<unsigned_long> *local_1a8;
  __atomic_base<unsigned_long> local_1a0;
  memory_order local_198;
  undefined4 local_194;
  atomic<unsigned_long> *local_190;
  __atomic_base<unsigned_long> local_188;
  memory_order local_180;
  undefined4 local_17c;
  atomic<unsigned_long> *local_178;
  __atomic_base<unsigned_long> local_170;
  memory_order local_168;
  undefined4 local_164;
  atomic<unsigned_long> *local_160;
  __atomic_base<unsigned_long> local_158;
  memory_order local_150;
  undefined4 local_14c;
  atomic<unsigned_long> *local_148;
  __int_type local_140;
  memory_order local_138;
  int local_134;
  __int_type local_130;
  atomic<unsigned_long> *local_128;
  __int_type local_120;
  memory_order local_118;
  int local_114;
  __atomic_base<unsigned_long> local_110;
  atomic<unsigned_long> *local_108;
  __int_type local_100;
  memory_order local_f8;
  int local_f4;
  __atomic_base<unsigned_long> local_f0;
  atomic<unsigned_long> *local_e8;
  __int_type local_e0;
  memory_order local_d8;
  int local_d4;
  __atomic_base<unsigned_long> local_d0;
  atomic<unsigned_long> *local_c8;
  __int_type local_c0;
  memory_order local_b8;
  int local_b4;
  __atomic_base<unsigned_long> local_b0;
  atomic<unsigned_long> *local_a8;
  __int_type local_a0;
  memory_order local_98;
  int local_94;
  __atomic_base<unsigned_long> local_90;
  atomic<unsigned_long> *local_88;
  __int_type local_80;
  memory_order local_78;
  int local_74;
  __atomic_base<unsigned_long> local_70;
  atomic<unsigned_long> *local_68;
  __int_type local_60;
  memory_order local_58;
  int local_54;
  __atomic_base<unsigned_long> local_50;
  atomic<unsigned_long> *local_48;
  __int_type local_40;
  memory_order local_38;
  int local_34;
  __atomic_base<unsigned_long> local_30;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_234 = 0;
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar2 = binlog::Session::minSeverity((Session *)0x1024b7);
  if (SVar2 < 0x81) {
    local_148 = &main::_binlog_sid;
    local_14c = 0;
    local_150 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_158 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_240 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_2f8 = 0;
      local_2f0 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"main",&local_2f9);
      local_31d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c8,"main",local_30d);
      local_31c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_30e);
      local_31b = 1;
      local_288 = 0x59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"{}",&local_30f);
      local_31a = 1;
      local_317 = binlog::detail::concatenated_tags<char_const(&)[3],Empty>
                            ((char (*) [3])in_stack_ffffffffffffecb8,
                             (Empty *)in_stack_ffffffffffffecb0);
      pacVar4 = mserialize::cx_string<7UL>::data(&local_317);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_260,*pacVar4,local_319);
      local_31a = 0;
      local_31b = 0;
      local_31c = 0;
      local_31d = 0;
      local_240._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
      binlog::EventSource::~EventSource(in_stack_ffffffffffffecb0);
      std::allocator<char>::~allocator((allocator<char> *)local_319);
      std::allocator<char>::~allocator((allocator<char> *)&local_30f);
      std::allocator<char>::~allocator((allocator<char> *)&local_30e);
      std::allocator<char>::~allocator((allocator<char> *)local_30d);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      local_8 = &main::_binlog_sid;
      local_10._M_i = local_240._M_i;
      local_14 = 5;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10._M_i;
      if ((local_14 != 3) && (local_14 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[3],Empty>
              (in_stack_ffffffffffffecc0,(uint64_t)in_stack_ffffffffffffecb8,
               (uint64_t)in_stack_ffffffffffffecb0,(char (*) [3])in_stack_ffffffffffffeca8,
               (Empty *)0x102a9f);
  }
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar2 = binlog::Session::minSeverity((Session *)0x102aba);
  if (SVar2 < 0x81) {
    local_160 = &main::_binlog_sid;
    local_164 = 0;
    local_168 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_170 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_328 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_3e0 = 0;
      local_3d8 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3d0,"main",&local_3e1);
      local_415 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b0,"main",&local_3e2);
      local_414 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_390,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_3e3);
      local_413 = 1;
      local_370 = 0x5c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_368,"{}",&local_3e4);
      local_412 = 1;
      local_3fc = 0x7b;
      cVar12 = binlog::detail::concatenated_tags<char_const(&)[3],Single>
                         (in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8);
      local_3f8._data._8_5_ = cVar12._data._8_5_;
      local_408 = cVar12._data._8_4_;
      local_404 = cVar12._data[0xc];
      local_410 = cVar12._data._0_5_;
      acStack_40b = cVar12._data._5_3_;
      local_3f8._data._0_5_ = local_410;
      local_3f8._data._5_3_ = acStack_40b;
      pacVar5 = mserialize::cx_string<12UL>::data(&local_3f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_348,*pacVar5,&local_411);
      local_412 = 0;
      local_413 = 0;
      local_414 = 0;
      local_415 = 0;
      local_328._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
      binlog::EventSource::~EventSource(in_stack_ffffffffffffecb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e4);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e3);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e2);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
      local_28 = &main::_binlog_sid;
      local_30._M_i = local_328._M_i;
      local_34 = 5;
      local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_40 = local_30._M_i;
      if ((local_34 != 3) && (local_34 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_30._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    local_41c = 0x7b;
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[3],Single>
              (in_stack_ffffffffffffecc0,(uint64_t)in_stack_ffffffffffffecb8,
               (uint64_t)in_stack_ffffffffffffecb0,(char (*) [3])in_stack_ffffffffffffeca8,
               (Single *)0x1030fc);
  }
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar2 = binlog::Session::minSeverity((Session *)0x103117);
  cVar1._data[8] = local_4f4._data[8];
  cVar1._data[9] = local_4f4._data[9];
  cVar1._data[10] = local_4f4._data[10];
  cVar1._data[0xb] = local_4f4._data[0xb];
  cVar1._data[0xc] = local_4f4._data[0xc];
  cVar1._data[0xd] = local_4f4._data[0xd];
  cVar1._data[0xe] = local_4f4._data[0xe];
  cVar1._data[0xf] = local_4f4._data[0xf];
  cVar1._data[0] = local_4f4._data[0];
  cVar1._data[1] = local_4f4._data[1];
  cVar1._data[2] = local_4f4._data[2];
  cVar1._data[3] = local_4f4._data[3];
  cVar1._data[4] = local_4f4._data[4];
  cVar1._data[5] = local_4f4._data[5];
  cVar1._data[6] = local_4f4._data[6];
  cVar1._data[7] = local_4f4._data[7];
  if (SVar2 < 0x81) {
    local_178 = &main::_binlog_sid;
    local_17c = 0;
    local_180 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_188 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_428 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_4e0 = 0;
      local_4d8 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d0,"main",&local_4e1);
      local_526 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4b0,"main",&local_4e2);
      local_525 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_490,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_4e3);
      local_524 = 1;
      local_470 = 0x5f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_468,"{}",&local_4e4);
      local_523 = 1;
      local_520 = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_518,"three",&local_521);
      local_4f4 = binlog::detail::concatenated_tags<char_const(&)[3],Pair>
                            ((char (*) [3])in_stack_ffffffffffffecc0,in_stack_ffffffffffffecb8);
      pacVar6 = mserialize::cx_string<15UL>::data(&local_4f4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_448,*pacVar6,&local_522);
      local_523 = 0;
      local_524 = 0;
      local_525 = 0;
      local_526 = 0;
      local_428._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
      binlog::EventSource::~EventSource(in_stack_ffffffffffffecb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_522);
      Pair::~Pair((Pair *)0x1034ce);
      std::allocator<char>::~allocator((allocator<char> *)&local_521);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e4);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e3);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e2);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
      local_48 = &main::_binlog_sid;
      local_50._M_i = local_428._M_i;
      local_54 = 5;
      local_58 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_60 = local_50._M_i;
      if ((local_54 != 3) && (local_54 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_50._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    local_550 = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_548,"three",&local_551);
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[3],Pair>
              (in_stack_ffffffffffffecc0,(uint64_t)in_stack_ffffffffffffecb8,
               (uint64_t)in_stack_ffffffffffffecb0,(char (*) [3])in_stack_ffffffffffffeca8,
               (Pair *)0x10380d);
    Pair::~Pair((Pair *)0x10381c);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    cVar1._data = local_4f4._data;
  }
  local_4f4._data = cVar1._data;
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar2 = binlog::Session::minSeverity((Session *)0x10388d);
  if (SVar2 < 0x81) {
    local_190 = &main::_binlog_sid;
    local_194 = 0;
    local_198 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_1a0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_560 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_618 = 0;
      local_610 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_608,"main",&local_619);
      local_634 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e8,"main",&local_61a);
      local_633 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_5c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_61b);
      local_632 = 1;
      local_5a8 = 0x62;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a0,"{}",&local_61c);
      local_631 = 1;
      binlog::detail::concatenated_tags<char_const(&)[3],Getter>
                ((char (*) [3])CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0),
                 (Getter *)in_stack_ffffffffffffecc8);
      pacVar7 = mserialize::cx_string<17UL>::data(&local_62e);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_580,*pacVar7,local_630);
      local_631 = 0;
      local_632 = 0;
      local_633 = 0;
      local_634 = 0;
      local_560._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
      binlog::EventSource::~EventSource(in_stack_ffffffffffffecb0);
      std::allocator<char>::~allocator((allocator<char> *)local_630);
      std::allocator<char>::~allocator((allocator<char> *)&local_61c);
      std::allocator<char>::~allocator((allocator<char> *)&local_61b);
      std::allocator<char>::~allocator((allocator<char> *)&local_61a);
      std::allocator<char>::~allocator((allocator<char> *)&local_619);
      local_68 = &main::_binlog_sid;
      local_70._M_i = local_560._M_i;
      local_74 = 5;
      local_78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_80 = local_70._M_i;
      if ((local_74 != 3) && (local_74 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_70._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[3],Getter>
              (in_stack_ffffffffffffecc0,(uint64_t)in_stack_ffffffffffffecb8,
               (uint64_t)in_stack_ffffffffffffecb0,(char (*) [3])in_stack_ffffffffffffeca8,
               (Getter *)0x103e65);
  }
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar2 = binlog::Session::minSeverity((Session *)0x103e80);
  if (SVar2 < 0x81) {
    local_1a8 = &main::_binlog_sid;
    local_1ac = 0;
    local_1b0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_1b8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_640 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_6f8 = 0;
      local_6f0 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6e8,"main",&local_6f9);
      local_721 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6c8,"main",&local_6fa);
      local_720 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_6a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_6fb);
      local_71f = 1;
      local_688 = 0x65;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_680,"{}",&local_6fc);
      local_71e = 1;
      local_71c = 3;
      binlog::detail::concatenated_tags<char_const(&)[3],app::Namespaced>
                ((char (*) [3])in_stack_ffffffffffffece0,(Namespaced *)in_stack_ffffffffffffecd8);
      pacVar8 = mserialize::cx_string<25UL>::data(&local_716);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_660,*pacVar8,&local_71d);
      local_71e = 0;
      local_71f = 0;
      local_720 = 0;
      local_721 = 0;
      local_640._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
      binlog::EventSource::~EventSource(in_stack_ffffffffffffecb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_71d);
      std::allocator<char>::~allocator((allocator<char> *)&local_6fc);
      std::allocator<char>::~allocator((allocator<char> *)&local_6fb);
      std::allocator<char>::~allocator((allocator<char> *)&local_6fa);
      std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
      local_88 = &main::_binlog_sid;
      local_90._M_i = local_640._M_i;
      local_94 = 5;
      local_98 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_a0 = local_90._M_i;
      if ((local_94 != 3) && (local_94 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_90._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    local_728 = 3;
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[3],app::Namespaced>
              (in_stack_ffffffffffffecc0,(uint64_t)in_stack_ffffffffffffecb8,
               (uint64_t)in_stack_ffffffffffffecb0,(char (*) [3])in_stack_ffffffffffffeca8,
               (Namespaced *)0x10446e);
  }
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar2 = binlog::Session::minSeverity((Session *)0x104489);
  if (SVar2 < 0x81) {
    local_1c0 = &main::_binlog_sid;
    local_1c4 = 0;
    local_1c8 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_1d0 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_730 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_7e8 = 0;
      local_7e0 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7d8,"main",&local_7e9);
      local_80d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7b8,"main",&local_7ea);
      local_80c = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_798,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_7eb);
      local_80b = 1;
      local_778 = 0x68;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_770,"{}",&local_7ec);
      local_80a = 1;
      local_808.a = 0;
      local_808.b = 0;
      Private::Private(&local_808);
      binlog::detail::concatenated_tags<char_const(&)[3],Private>
                ((char (*) [3])CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0),
                 (Private *)in_stack_ffffffffffffecc8);
      pacVar7 = mserialize::cx_string<17UL>::data(&local_7fe);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_750,*pacVar7,&local_809);
      local_80a = 0;
      local_80b = 0;
      local_80c = 0;
      local_80d = 0;
      local_730._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
      binlog::EventSource::~EventSource(in_stack_ffffffffffffecb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_809);
      std::allocator<char>::~allocator((allocator<char> *)&local_7ec);
      std::allocator<char>::~allocator((allocator<char> *)&local_7eb);
      std::allocator<char>::~allocator((allocator<char> *)&local_7ea);
      std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
      local_a8 = &main::_binlog_sid;
      local_b0._M_i = local_730._M_i;
      local_b4 = 5;
      local_b8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_c0 = local_b0._M_i;
      if ((local_b4 != 3) && (local_b4 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_b0._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    memset(&local_818,0,8);
    Private::Private(&local_818);
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[3],Private>
              (in_stack_ffffffffffffecc0,(uint64_t)in_stack_ffffffffffffecb8,
               (uint64_t)in_stack_ffffffffffffecb0,(char (*) [3])in_stack_ffffffffffffeca8,
               (Private *)0x104ab0);
  }
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar2 = binlog::Session::minSeverity((Session *)0x104acb);
  if (SVar2 < 0x81) {
    local_1d8 = &main::_binlog_sid;
    local_1dc = 0;
    local_1e0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_1e8 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_820 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_8d8 = 0;
      local_8d0 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8c8,"main",&local_8d9);
      local_911 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8a8,"main",&local_8da);
      local_910 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_888,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_8db);
      local_90f = 1;
      local_868 = 0x6b;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_860,"{}",&local_8dc);
      local_90e = 1;
      local_90c = 1;
      local_908 = 1;
      local_904 = 2;
      local_900 = 3;
      binlog::detail::concatenated_tags<char_const(&)[3],Triplet<int,bool,2ul>>
                ((char (*) [3])in_stack_ffffffffffffece0,
                 (Triplet<int,_bool,_2UL> *)in_stack_ffffffffffffecd8);
      pacVar9 = mserialize::cx_string<29UL>::data(&local_8fa);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_840,*pacVar9,&local_90d);
      local_90e = 0;
      local_90f = 0;
      local_910 = 0;
      local_911 = 0;
      local_820._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
      binlog::EventSource::~EventSource(in_stack_ffffffffffffecb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_90d);
      std::allocator<char>::~allocator((allocator<char> *)&local_8dc);
      std::allocator<char>::~allocator((allocator<char> *)&local_8db);
      std::allocator<char>::~allocator((allocator<char> *)&local_8da);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
      local_c8 = &main::_binlog_sid;
      local_d0._M_i = local_820._M_i;
      local_d4 = 5;
      local_d8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_e0 = local_d0._M_i;
      if ((local_d4 != 3) && (local_d4 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_d0._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    local_924 = 1;
    local_920 = 1;
    local_91c = 2;
    local_918 = 3;
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[3],Triplet<int,bool,2ul>>
              (in_stack_ffffffffffffecc0,(uint64_t)in_stack_ffffffffffffecb8,
               (uint64_t)in_stack_ffffffffffffecb0,(char (*) [3])in_stack_ffffffffffffeca8,
               (Triplet<int,_bool,_2UL> *)0x1050f5);
  }
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar2 = binlog::Session::minSeverity((Session *)0x105110);
  if (SVar2 < 0x81) {
    local_1f0 = &main::_binlog_sid;
    local_1f4 = 0;
    local_1f8 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_200 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_930 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_9e8 = 0;
      local_9e0 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9d8,"main",&local_9e9);
      local_a11 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_9b8,"main",&local_9ea);
      local_a10 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_998,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_9eb);
      local_a0f = 1;
      local_978 = 0x6e;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_970,"{}",&local_9ec);
      local_a0e = 1;
      binlog::detail::concatenated_tags<char_const(&)[3],first&>
                ((char (*) [3])in_stack_ffffffffffffece0,(first *)in_stack_ffffffffffffecd8);
      pacVar10 = mserialize::cx_string<31UL>::data(&local_a0c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_950,*pacVar10,&local_a0d);
      local_a0e = 0;
      local_a0f = 0;
      local_a10 = 0;
      local_a11 = 0;
      local_930._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
      binlog::EventSource::~EventSource(in_stack_ffffffffffffecb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a0d);
      std::allocator<char>::~allocator((allocator<char> *)&local_9ec);
      std::allocator<char>::~allocator((allocator<char> *)&local_9eb);
      std::allocator<char>::~allocator((allocator<char> *)&local_9ea);
      std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
      local_e8 = &main::_binlog_sid;
      local_f0._M_i = local_930._M_i;
      local_f4 = 5;
      local_f8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_100 = local_f0._M_i;
      if ((local_f4 != 3) && (local_f4 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_f0._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[3],first&>
              (in_stack_ffffffffffffecc0,(uint64_t)in_stack_ffffffffffffecb8,
               (uint64_t)in_stack_ffffffffffffecb0,(char (*) [3])in_stack_ffffffffffffeca8,
               (first *)0x1056e6);
  }
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar2 = binlog::Session::minSeverity((Session *)0x105701);
  if (SVar2 < 0x81) {
    local_208 = &main::_binlog_sid;
    local_20c = 0;
    local_210 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_218 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_a20 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_ad8 = 0;
      local_ad0 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_ac8,"main",&local_ad9);
      local_b1e = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_aa8,"main",&local_ada);
      local_b1d = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a88,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_adb);
      local_b1c = 1;
      local_a68 = 0x73;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a60,"My foo: {}",&local_adc);
      local_b1b = 1;
      local_b18 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b10,"two",&local_b19);
      binlog::detail::concatenated_tags<char_const(&)[11],Foo>
                ((char (*) [11])CONCAT44(in_stack_ffffffffffffecd4,in_stack_ffffffffffffecd0),
                 in_stack_ffffffffffffecc8);
      pacVar11 = mserialize::cx_string<18UL>::data(&local_aef);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a40,*pacVar11,&local_b1a);
      local_b1b = 0;
      local_b1c = 0;
      local_b1d = 0;
      local_b1e = 0;
      local_a20._M_i =
           binlog::Session::addEventSource(in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8);
      binlog::EventSource::~EventSource(in_stack_ffffffffffffecb0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1a);
      Foo::~Foo((Foo *)0x105a90);
      std::allocator<char>::~allocator((allocator<char> *)&local_b19);
      std::allocator<char>::~allocator((allocator<char> *)&local_adc);
      std::allocator<char>::~allocator((allocator<char> *)&local_adb);
      std::allocator<char>::~allocator((allocator<char> *)&local_ada);
      std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
      local_108 = &main::_binlog_sid;
      local_110._M_i = local_a20._M_i;
      local_114 = 5;
      local_118 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_120 = local_110._M_i;
      if ((local_114 != 3) && (local_114 == 5)) {
        LOCK();
        UNLOCK();
      }
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_110._M_i;
    }
    binlog::default_thread_local_writer();
    binlog::clockNow();
    local_b48 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b40,"two",&local_b49);
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[11],Foo>
              (in_stack_ffffffffffffecc0,(uint64_t)in_stack_ffffffffffffecb8,
               (uint64_t)in_stack_ffffffffffffecb0,(char (*) [11])in_stack_ffffffffffffeca8,
               (Foo *)0x105dcf);
    Foo::~Foo((Foo *)0x105dde);
    std::allocator<char>::~allocator((allocator<char> *)&local_b49);
  }
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar2 = binlog::Session::minSeverity((Session *)0x105e4f);
  if (SVar2 < 0x81) {
    local_220 = &main::_binlog_sid;
    local_224 = 0;
    local_228 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_230 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_b58 = main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_c10 = 0;
      local_c08 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c00,"main",&local_c11);
      local_c45 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_be0,"main",&local_c12);
      local_c44 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_bc0,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingAdaptedStructs.cpp"
                 ,&local_c13);
      local_c43 = 1;
      local_ba0 = 0x79;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b98,"Hierarchy: {}",&local_c14);
      local_c42 = 1;
      this_00 = local_b78;
      local_c41._9_4_ = 0;
      local_c41._1_8_ = 0;
      Derived::Derived((Derived *)in_stack_ffffffffffffecb0);
      binlog::detail::concatenated_tags<char_const(&)[14],Derived>
                ((char (*) [14])in_stack_ffffffffffffece0,(Derived *)in_stack_ffffffffffffecd8);
      pacVar9 = mserialize::cx_string<29UL>::data((cx_string<29UL> *)(local_c41 + 0xf));
      this = (Session *)local_c41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(this_00,*pacVar9,(allocator *)this);
      local_c42 = 0;
      local_c43 = 0;
      local_c44 = 0;
      local_c45 = 0;
      local_b58._M_i = binlog::Session::addEventSource(this,in_stack_ffffffffffffecd8);
      binlog::EventSource::~EventSource(in_stack_ffffffffffffecb0);
      std::allocator<char>::~allocator((allocator<char> *)local_c41);
      std::allocator<char>::~allocator((allocator<char> *)&local_c14);
      std::allocator<char>::~allocator((allocator<char> *)&local_c13);
      std::allocator<char>::~allocator((allocator<char> *)&local_c12);
      std::allocator<char>::~allocator((allocator<char> *)&local_c11);
      local_128 = &main::_binlog_sid;
      local_130 = local_b58._M_i;
      local_134 = 5;
      paVar13 = &main::_binlog_sid;
      local_138 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_140 = local_130;
      if (local_134 == 3) {
        (paVar13->super___atomic_base<unsigned_long>)._M_i = local_130;
      }
      else if (local_134 == 5) {
        LOCK();
        (paVar13->super___atomic_base<unsigned_long>)._M_i = local_130;
        UNLOCK();
      }
      else {
        (paVar13->super___atomic_base<unsigned_long>)._M_i = local_130;
      }
    }
    in_stack_ffffffffffffecb0 = (EventSource *)binlog::default_thread_local_writer();
    eventSourceId._M_i = local_b58._M_i;
    pSVar3 = (SessionWriter *)binlog::clockNow();
    memset(local_c54,0,0xc);
    Derived::Derived((Derived *)in_stack_ffffffffffffecb0);
    binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[14],Derived>
              (pSVar3,eventSourceId._M_i,(uint64_t)in_stack_ffffffffffffecb0,
               in_stack_ffffffffffffeca8,(Derived *)0x106418);
  }
  binlog::consume<std::ostream>
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffecb0);
  return 0;
}

Assistant:

int main()
{
  BINLOG_INFO("{}", Empty{});
  // Outputs: Empty

  BINLOG_INFO("{}", Single{123});
  // Outputs: Single{ a: 123 }

  BINLOG_INFO("{}", Pair{2, "three"});
  // Outputs: Pair{ a: 2, b: three }

  BINLOG_INFO("{}", Getter{});
  // Outputs: Getter{ a: 33, b: foo }

  BINLOG_INFO("{}", app::Namespaced{3});
  // Outputs: app::Namespaced{ a: 3, b: 2 }

  BINLOG_INFO("{}", Private{});
  // Outputs: Private{ a: 3, b: 4 }

  BINLOG_INFO("{}", Triplet<int, bool, 2>{1, true, {2,3}});
  // Outputs: Triplet{ a: 1, b: true, c: [2, 3] }

  BINLOG_INFO("{}", way);
  // Outputs: first{ business: first::First }

  //[mixed

  BINLOG_INFO("My foo: {}", Foo{1, "two"});
  // Outputs: My foo: Foo{ a: 1, b: two, c: true }
  //]

  //[derived

  BINLOG_INFO("Hierarchy: {}", Derived{});
  // Outputs: Hierarchy: Derived{ Base{ a: 0 }, b: 1, c: 2 }
  //]

  binlog::consume(std::cout);
  return 0;
}